

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O3

void create_cb(uv_fs_t *req)

{
  ssize_t sVar1;
  undefined8 __s1;
  int iVar2;
  ulong uVar3;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  ulong uVar6;
  uint uVar7;
  uv_os_fd_t file;
  uv__queue *unaff_RBX;
  uv__queue *puVar8;
  char *pcVar9;
  uv_fs_t *puVar10;
  uv_fs_t *puVar11;
  uv_fs_cb unaff_R12;
  char *unaff_R13;
  uv_fs_t *unaff_R14;
  uv_dirent_t *unaff_R15;
  uv_buf_t uVar12;
  uv_dirent_t dent;
  uv_dirent_t dent_00;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStackY_1b8 [32];
  code *pcStackY_198;
  undefined1 auStackY_190 [16];
  uv_req_type uStackY_180;
  void *pvStackY_178;
  uv_loop_t *puStackY_170;
  uv_fs_cb p_StackY_168;
  char *pcStackY_160;
  uv_fs_t *puStackY_158;
  uv_dirent_t *puStackY_150;
  uv_fs_cb p_StackY_140;
  undefined1 auStackY_138 [16];
  uv_loop_t *puStackY_128;
  uv_dirent_t uStackY_120;
  char *pcStackY_110;
  uint64_t uStack_98;
  uv_loop_t *puStack_90;
  uv_loop_s *puStack_50;
  uv__queue *puStack_48;
  _func_void_uv__work_ptr *p_Stack_38;
  undefined1 auStack_30 [8];
  uv_buf_t *local_10;
  
  puVar8 = (uv__queue *)open_req1.result;
  if (req == &open_req1) {
    local_10 = (uv_buf_t *)(long)open_req1.fs_type;
    if (local_10 != (uv_buf_t *)0x1) goto LAB_0018a1c4;
    local_10 = (uv_buf_t *)open_req1.result;
    if (open_req1.result < 0) goto LAB_0018a1d3;
    create_cb_count = create_cb_count + 1;
    auStack_30 = (undefined1  [8])0x18a14a;
    uv_fs_req_cleanup(&open_req1);
    auStack_30 = (undefined1  [8])0x18a15b;
    iov = uv_buf_init(test_buf,0xd);
    auStack_30 = (undefined1  [8])0x18a19d;
    iVar2 = uv_fs_write(loop,&write_req,(uv_os_fd_t)puVar8,&iov,1,-1,write_cb);
    local_10 = (uv_buf_t *)(long)iVar2;
    if (local_10 == (uv_buf_t *)0x0) {
      return;
    }
  }
  else {
    auStack_30 = (undefined1  [8])0x18a1c4;
    create_cb_cold_1();
    puVar8 = unaff_RBX;
LAB_0018a1c4:
    auStack_30 = (undefined1  [8])0x18a1d3;
    create_cb_cold_2();
LAB_0018a1d3:
    auStack_30 = (undefined1  [8])0x18a1e2;
    create_cb_cold_4();
  }
  puVar11 = (uv_fs_t *)&stack0xfffffffffffffff0;
  auStack_30 = (undefined1  [8])rename_cb;
  create_cb_cold_3();
  if (puVar11 == &rename_req) {
    auStack_30 = (undefined1  [8])(long)rename_req.fs_type;
    p_Stack_38 = (_func_void_uv__work_ptr *)0x15;
    if (auStack_30 != (undefined1  [8])0x15) goto LAB_0018a25e;
    auStack_30 = (undefined1  [8])rename_req.result;
    p_Stack_38 = (_func_void_uv__work_ptr *)0x0;
    if (rename_req.result == 0) {
      rename_cb_count = rename_cb_count + 1;
      uv_fs_req_cleanup(&rename_req);
      return;
    }
  }
  else {
    puStack_48 = (uv__queue *)0x18a25e;
    rename_cb_cold_1();
LAB_0018a25e:
    puStack_48 = (uv__queue *)0x18a26d;
    rename_cb_cold_2();
  }
  puVar11 = (uv_fs_t *)auStack_30;
  puStack_48 = (uv__queue *)open_cb;
  rename_cb_cold_3();
  sVar1 = open_req1.result;
  puStack_48 = puVar8;
  if (puVar11 == &open_req1) {
    puStack_50 = (uv_loop_s *)(long)open_req1.fs_type;
    if (puStack_50 != (uv_loop_s *)0x1) goto LAB_0018a3cb;
    if (open_req1.result < 0) goto LAB_0018a3da;
    open_cb_count = open_cb_count + 1;
    if (open_req1.path == (char *)0x0) goto LAB_0018a3e1;
    uVar3 = 0x746573745f66696c;
    uVar6 = *(ulong *)open_req1.path;
    uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
            (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
            (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
    if (uVar6 == 0x746573745f66696c) {
      uVar3 = 0x745f66696c653200;
      uVar6 = *(ulong *)(open_req1.path + 3);
      uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18
              | (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18
              | (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
      uVar7 = 0;
      if (uVar6 != 0x745f66696c653200) goto LAB_0018a309;
    }
    else {
LAB_0018a309:
      uVar7 = -(uint)(uVar6 < uVar3) | 1;
    }
    puStack_50 = (uv_loop_s *)(long)(int)uVar7;
    if (puStack_50 != (uv_loop_s *)0x0) goto LAB_0018a3e6;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar12 = uv_buf_init(buf,0x20);
    iov = uVar12;
    iVar2 = uv_fs_read(loop,&read_req,(uv_os_fd_t)sVar1,&iov,1,-1,read_cb);
    puStack_50 = (uv_loop_s *)(long)iVar2;
    if (puStack_50 == (uv_loop_s *)0x0) {
      return;
    }
  }
  else {
    open_cb_cold_1();
LAB_0018a3cb:
    open_cb_cold_2();
LAB_0018a3da:
    open_cb_cold_6();
LAB_0018a3e1:
    open_cb_cold_5();
LAB_0018a3e6:
    open_cb_cold_3();
  }
  iVar2 = (int)&puStack_50;
  open_cb_cold_4();
  fs_file_sync(iVar2);
  fs_file_sync(iVar2);
  puVar4 = uv_default_loop();
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  uv_run(puVar4,UV_RUN_DEFAULT);
  puVar5 = uv_default_loop();
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_file_sync_cold_1();
  puStack_90 = puVar4;
  unlink("test_file");
  unlink("test_file2");
  loop = uv_default_loop();
  iVar2 = uv_fs_open(loop,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  sVar1 = open_req1.result;
  uStack_98 = (uint64_t)iVar2;
  if (uStack_98 == 0) {
    if (open_req1.result < 0) goto LAB_0018aab4;
    uv_fs_req_cleanup(&open_req1);
    uVar12 = uv_buf_init(test_buf,0xd);
    unaff_R14 = (uv_fs_t *)0x0;
    iov = uVar12;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_os_fd_t)sVar1,&iov,1,-1,(uv_fs_cb)0x0);
    uStack_98 = (uint64_t)iVar2;
    if ((long)uStack_98 < 0) goto LAB_0018aab9;
    uStack_98 = write_req.result;
    if (write_req.result < 0) goto LAB_0018aac8;
    uv_fs_req_cleanup(&write_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_os_fd_t)sVar1,(uv_fs_cb)0x0);
    uStack_98 = (uint64_t)iVar2;
    if (uStack_98 != 0) goto LAB_0018aad7;
    uStack_98 = close_req.result;
    if (close_req.result != 0) goto LAB_0018aae6;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",2,0,(uv_fs_cb)0x0);
    sVar1 = open_req1.result;
    uStack_98 = (uint64_t)iVar2;
    if (uStack_98 != 0) goto LAB_0018aaf5;
    uStack_98 = open_req1.result;
    if (open_req1.result < 0) goto LAB_0018ab04;
    uv_fs_req_cleanup(&open_req1);
    uVar12 = uv_buf_init(buf,0x20);
    unaff_R14 = (uv_fs_t *)0x0;
    file = (uv_os_fd_t)sVar1;
    iov = uVar12;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,file,&iov,1,-1,(uv_fs_cb)0x0);
    uStack_98 = (uint64_t)iVar2;
    if ((long)uStack_98 < 0) goto LAB_0018ab13;
    uStack_98 = read_req.result;
    if (read_req.result < 0) goto LAB_0018ab22;
    iVar2 = strcmp(buf,test_buf);
    uStack_98 = (uint64_t)iVar2;
    if (uStack_98 != 0) goto LAB_0018ab31;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_ftruncate((uv_loop_t *)0x0,&ftruncate_req,file,7,(uv_fs_cb)0x0);
    uStack_98 = (uint64_t)iVar2;
    if (uStack_98 != 0) goto LAB_0018ab40;
    uStack_98 = ftruncate_req.result;
    if (ftruncate_req.result != 0) goto LAB_0018ab4f;
    uv_fs_req_cleanup(&ftruncate_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,file,(uv_fs_cb)0x0);
    uStack_98 = (uint64_t)iVar2;
    if (uStack_98 != 0) goto LAB_0018ab5e;
    uStack_98 = close_req.result;
    if (close_req.result != 0) goto LAB_0018ab6d;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_rename((uv_loop_t *)0x0,&rename_req,"test_file","test_file2",(uv_fs_cb)0x0);
    uStack_98 = (uint64_t)iVar2;
    if (uStack_98 != 0) goto LAB_0018ab7c;
    uStack_98 = rename_req.result;
    if (rename_req.result != 0) goto LAB_0018ab8b;
    uv_fs_req_cleanup(&rename_req);
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file2",0,0,(uv_fs_cb)0x0);
    sVar1 = open_req1.result;
    uStack_98 = (uint64_t)iVar2;
    if (uStack_98 != 0) goto LAB_0018ab9a;
    uStack_98 = open_req1.result;
    if (open_req1.result < 0) goto LAB_0018aba9;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar12 = uv_buf_init(buf,0x20);
    unaff_R14 = (uv_fs_t *)0x0;
    iov = uVar12;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_os_fd_t)sVar1,&iov,1,-1,(uv_fs_cb)0x0);
    uStack_98 = (uint64_t)iVar2;
    if ((long)uStack_98 < 0) goto LAB_0018abb8;
    uStack_98 = read_req.result;
    if (read_req.result < 0) goto LAB_0018abc7;
    iVar2 = strcmp(buf,"test-bu");
    uStack_98 = (uint64_t)iVar2;
    if (uStack_98 != 0) goto LAB_0018abd6;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_os_fd_t)sVar1,(uv_fs_cb)0x0);
    uStack_98 = (uint64_t)iVar2;
    if (uStack_98 != 0) goto LAB_0018abe5;
    uStack_98 = close_req.result;
    if (close_req.result != 0) goto LAB_0018abf4;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_unlink((uv_loop_t *)0x0,&unlink_req,"test_file2",(uv_fs_cb)0x0);
    uStack_98 = (uint64_t)iVar2;
    if (uStack_98 != 0) goto LAB_0018ac03;
    uStack_98 = unlink_req.result;
    if (unlink_req.result == 0) {
      uv_fs_req_cleanup(&unlink_req);
      unlink("test_file");
      unlink("test_file2");
      return;
    }
  }
  else {
    fs_file_sync_cold_1();
LAB_0018aab4:
    fs_file_sync_cold_2();
LAB_0018aab9:
    fs_file_sync_cold_26();
LAB_0018aac8:
    fs_file_sync_cold_25();
LAB_0018aad7:
    fs_file_sync_cold_3();
LAB_0018aae6:
    fs_file_sync_cold_4();
LAB_0018aaf5:
    fs_file_sync_cold_5();
LAB_0018ab04:
    fs_file_sync_cold_24();
LAB_0018ab13:
    fs_file_sync_cold_23();
LAB_0018ab22:
    fs_file_sync_cold_22();
LAB_0018ab31:
    fs_file_sync_cold_6();
LAB_0018ab40:
    fs_file_sync_cold_7();
LAB_0018ab4f:
    fs_file_sync_cold_8();
LAB_0018ab5e:
    fs_file_sync_cold_9();
LAB_0018ab6d:
    fs_file_sync_cold_10();
LAB_0018ab7c:
    fs_file_sync_cold_11();
LAB_0018ab8b:
    fs_file_sync_cold_12();
LAB_0018ab9a:
    fs_file_sync_cold_13();
LAB_0018aba9:
    fs_file_sync_cold_21();
LAB_0018abb8:
    fs_file_sync_cold_20();
LAB_0018abc7:
    fs_file_sync_cold_19();
LAB_0018abd6:
    fs_file_sync_cold_14();
LAB_0018abe5:
    fs_file_sync_cold_15();
LAB_0018abf4:
    fs_file_sync_cold_16();
LAB_0018ac03:
    fs_file_sync_cold_17();
  }
  iVar2 = (int)&uStack_98;
  fs_file_sync_cold_18();
  fs_file_write_null_buffer(iVar2);
  fs_file_write_null_buffer(iVar2);
  puVar4 = loop;
  uv_walk(loop,close_walk_cb,(void *)0x0);
  uv_run(puVar4,UV_RUN_DEFAULT);
  iVar2 = uv_loop_close(loop);
  if (iVar2 == 0) {
    uv_library_shutdown();
    return;
  }
  run_test_fs_file_write_null_buffer_cold_1();
  pcVar9 = "test_file";
  unlink("test_file");
  loop = uv_default_loop();
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  sVar1 = open_req1.result;
  if (iVar2 == 0) {
    pcVar9 = (char *)open_req1.result;
    if (open_req1.result < 0) goto LAB_0018ae30;
    uv_fs_req_cleanup(&open_req1);
    unaff_R14 = (uv_fs_t *)0x0;
    uVar12 = uv_buf_init((char *)0x0,0);
    iov = uVar12;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_os_fd_t)sVar1,&iov,1,-1,(uv_fs_cb)0x0);
    pcVar9 = (char *)sVar1;
    if (iVar2 != 0) goto LAB_0018ae3f;
    if (write_req.result != 0) goto LAB_0018ae4e;
    uv_fs_req_cleanup(&write_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_os_fd_t)sVar1,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0018ae5d;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      return;
    }
  }
  else {
    fs_file_write_null_buffer_cold_1();
LAB_0018ae30:
    fs_file_write_null_buffer_cold_6();
LAB_0018ae3f:
    fs_file_write_null_buffer_cold_2();
LAB_0018ae4e:
    fs_file_write_null_buffer_cold_3();
LAB_0018ae5d:
    fs_file_write_null_buffer_cold_4();
  }
  fs_file_write_null_buffer_cold_5();
  puVar11 = (uv_fs_t *)(auStackY_138 + 8);
  auStackY_138._0_8_ = (void *)0x18ae94;
  pcStackY_110 = pcVar9;
  unlink("test_dir/file1");
  auStackY_138._0_8_ = (void *)0x18aea0;
  unlink("test_dir/file2");
  puVar4 = (uv_loop_t *)0x1faff6;
  auStackY_138._0_8_ = (void *)0x18aeaf;
  rmdir("test_dir");
  auStackY_138._0_8_ = (void *)0x18aeb4;
  loop = uv_default_loop();
  auStackY_138._0_8_ = (void *)0x18aed9;
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  uStackY_120.name = (char *)(long)iVar2;
  auStackY_138._8_8_ = (uv_loop_t *)0x0;
  if (uStackY_120.name == (char *)0x0) {
    auStackY_138._0_8_ = (void *)0x18af05;
    uv_run(loop,UV_RUN_DEFAULT);
    uStackY_120.name = (char *)0x1;
    auStackY_138._8_8_ = SEXT48(mkdir_cb_count);
    if ((uv_loop_t *)auStackY_138._8_8_ != (uv_loop_t *)0x1) goto LAB_0018b527;
    auStackY_138._0_8_ = (void *)0x18af4b;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_dir/file1",0x41,0x180,(uv_fs_cb)0x0);
    puVar5 = (uv_loop_t *)open_req1.result;
    uStackY_120.name = (char *)(long)iVar2;
    auStackY_138._8_8_ = (uv_loop_t *)0x0;
    if (uStackY_120.name != (char *)0x0) goto LAB_0018b534;
    uStackY_120.name = (char *)open_req1.result;
    auStackY_138._8_8_ = (uv_loop_t *)0x0;
    if (open_req1.result < 0) goto LAB_0018b541;
    auStackY_138._0_8_ = (void *)0x18af98;
    uv_fs_req_cleanup(&open_req1);
    auStackY_138._0_8_ = (void *)0x18afaa;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_os_fd_t)puVar5,(uv_fs_cb)0x0);
    uStackY_120.name = (char *)(long)iVar2;
    auStackY_138._8_8_ = (uv_loop_t *)0x0;
    if (uStackY_120.name != (char *)0x0) goto LAB_0018b54e;
    auStackY_138._0_8_ = (void *)0x18afd4;
    uv_fs_req_cleanup(&close_req);
    auStackY_138._0_8_ = (void *)0x18aff7;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_dir/file2",0x41,0x180,(uv_fs_cb)0x0);
    puVar4 = (uv_loop_t *)open_req1.result;
    uStackY_120.name = (char *)(long)iVar2;
    auStackY_138._8_8_ = (uv_loop_t *)0x0;
    if (uStackY_120.name != (char *)0x0) goto LAB_0018b55b;
    uStackY_120.name = (char *)open_req1.result;
    auStackY_138._8_8_ = (uv_loop_t *)0x0;
    if (open_req1.result < 0) goto LAB_0018b568;
    auStackY_138._0_8_ = (void *)0x18b044;
    uv_fs_req_cleanup(&open_req1);
    auStackY_138._0_8_ = (void *)0x18b056;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_os_fd_t)puVar4,(uv_fs_cb)0x0);
    uStackY_120.name = (char *)(long)iVar2;
    auStackY_138._8_8_ = (uv_loop_t *)0x0;
    if (uStackY_120.name != (char *)0x0) goto LAB_0018b575;
    auStackY_138._0_8_ = (void *)0x18b080;
    uv_fs_req_cleanup(&close_req);
    auStackY_138._0_8_ = (void *)0x18b0a3;
    iVar2 = uv_fs_scandir(loop,&scandir_req,"test_dir",0,scandir_cb);
    uStackY_120.name = (char *)(long)iVar2;
    auStackY_138._8_8_ = (uv_loop_t *)0x0;
    if (uStackY_120.name != (char *)0x0) goto LAB_0018b582;
    auStackY_138._0_8_ = (void *)0x18b0cf;
    uv_run(loop,UV_RUN_DEFAULT);
    uStackY_120.name = (char *)0x1;
    auStackY_138._8_8_ = SEXT48(scandir_cb_count);
    if ((uv_loop_t *)auStackY_138._8_8_ != (uv_loop_t *)0x1) goto LAB_0018b58f;
    auStackY_138._0_8_ = (void *)0x18b10c;
    iVar2 = uv_fs_scandir((uv_loop_t *)0x0,&scandir_req,"test_dir",0,(uv_fs_cb)0x0);
    uStackY_120.name = (char *)0x2;
    auStackY_138._8_8_ = SEXT48(iVar2);
    if ((uv_loop_t *)auStackY_138._8_8_ != (uv_loop_t *)0x2) goto LAB_0018b59c;
    uStackY_120.name = (char *)0x2;
    auStackY_138._8_8_ = scandir_req.result;
    if (scandir_req.result != 2) goto LAB_0018b5a9;
    if (scandir_req.ptr == (void *)0x0) goto LAB_0018b5b6;
    auStackY_138._0_8_ = (void *)0x18b16c;
    iVar2 = uv_fs_scandir_next(&scandir_req,&uStackY_120);
    if (iVar2 != -0xfff) {
      puVar4 = (uv_loop_t *)0x1f9b18;
      unaff_R14 = &scandir_req;
      unaff_R15 = &uStackY_120;
      unaff_R12 = (uv_fs_cb)0x1f9b08;
      do {
        unaff_R13 = uStackY_120.name;
        pcVar9 = "file1";
        auStackY_138._0_8_ = (void *)0x18b19d;
        iVar2 = strcmp(uStackY_120.name,"file1");
        if (iVar2 != 0) {
          pcVar9 = "file2";
          auStackY_138._0_8_ = (void *)0x18b1ac;
          iVar2 = strcmp(unaff_R13,"file2");
          if (iVar2 != 0) {
            auStackY_138._0_8_ = (void *)0x18b51a;
            run_test_fs_async_dir_cold_11();
            goto LAB_0018b51a;
          }
        }
        dent.name = (char *)(ulong)uStackY_120.type;
        auStackY_138._0_8_ = (void *)0x18b1bd;
        dent._8_8_ = pcVar9;
        assert_is_file_type(dent);
        auStackY_138._0_8_ = (void *)0x18b1c8;
        iVar2 = uv_fs_scandir_next(&scandir_req,unaff_R15);
      } while (iVar2 != -0xfff);
    }
    auStackY_138._0_8_ = (void *)0x18b1db;
    uv_fs_req_cleanup(&scandir_req);
    if (scandir_req.ptr != (void *)0x0) goto LAB_0018b5bb;
    auStackY_138._0_8_ = (void *)0x18b20a;
    iVar2 = uv_fs_stat(loop,&stat_req,"test_dir",stat_cb);
    auStackY_138._8_8_ = SEXT48(iVar2);
    puStackY_128 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStackY_138._8_8_ != (uv_loop_t *)0x0) goto LAB_0018b5c0;
    auStackY_138._0_8_ = (void *)0x18b236;
    uv_run(loop,UV_RUN_DEFAULT);
    auStackY_138._0_8_ = (void *)0x18b257;
    iVar2 = uv_fs_stat(loop,&stat_req,"test_dir/",stat_cb);
    auStackY_138._8_8_ = SEXT48(iVar2);
    puStackY_128 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStackY_138._8_8_ != (uv_loop_t *)0x0) goto LAB_0018b5cd;
    auStackY_138._0_8_ = (void *)0x18b283;
    uv_run(loop,UV_RUN_DEFAULT);
    auStackY_138._0_8_ = (void *)0x18b2a4;
    iVar2 = uv_fs_lstat(loop,&stat_req,"test_dir",stat_cb);
    auStackY_138._8_8_ = SEXT48(iVar2);
    puStackY_128 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStackY_138._8_8_ != (uv_loop_t *)0x0) goto LAB_0018b5da;
    auStackY_138._0_8_ = (void *)0x18b2d0;
    uv_run(loop,UV_RUN_DEFAULT);
    auStackY_138._0_8_ = (void *)0x18b2f1;
    iVar2 = uv_fs_lstat(loop,&stat_req,"test_dir/",stat_cb);
    auStackY_138._8_8_ = SEXT48(iVar2);
    puStackY_128 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStackY_138._8_8_ != (uv_loop_t *)0x0) goto LAB_0018b5e7;
    auStackY_138._0_8_ = (void *)0x18b31d;
    uv_run(loop,UV_RUN_DEFAULT);
    auStackY_138._8_8_ = (uv_loop_t *)0x4;
    puStackY_128 = (uv_loop_t *)(long)stat_cb_count;
    if (puStackY_128 != (uv_loop_t *)0x4) goto LAB_0018b5f4;
    auStackY_138._0_8_ = (void *)0x18b361;
    iVar2 = uv_fs_unlink(loop,&unlink_req,"test_dir/file1",unlink_cb);
    auStackY_138._8_8_ = SEXT48(iVar2);
    puStackY_128 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStackY_138._8_8_ != (uv_loop_t *)0x0) goto LAB_0018b601;
    auStackY_138._0_8_ = (void *)0x18b38d;
    uv_run(loop,UV_RUN_DEFAULT);
    auStackY_138._8_8_ = (uv_loop_t *)0x1;
    puStackY_128 = (uv_loop_t *)(long)unlink_cb_count;
    if (puStackY_128 != (uv_loop_t *)0x1) goto LAB_0018b60e;
    auStackY_138._0_8_ = (void *)0x18b3d1;
    iVar2 = uv_fs_unlink(loop,&unlink_req,"test_dir/file2",unlink_cb);
    auStackY_138._8_8_ = SEXT48(iVar2);
    puStackY_128 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStackY_138._8_8_ != (uv_loop_t *)0x0) goto LAB_0018b61b;
    auStackY_138._0_8_ = (void *)0x18b3fd;
    uv_run(loop,UV_RUN_DEFAULT);
    auStackY_138._8_8_ = (uv_loop_t *)0x2;
    puStackY_128 = (uv_loop_t *)(long)unlink_cb_count;
    if (puStackY_128 != (uv_loop_t *)0x2) goto LAB_0018b628;
    auStackY_138._0_8_ = (void *)0x18b441;
    iVar2 = uv_fs_rmdir(loop,&rmdir_req,"test_dir",rmdir_cb);
    auStackY_138._8_8_ = SEXT48(iVar2);
    puStackY_128 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStackY_138._8_8_ != (uv_loop_t *)0x0) goto LAB_0018b635;
    auStackY_138._0_8_ = (void *)0x18b46d;
    uv_run(loop,UV_RUN_DEFAULT);
    auStackY_138._8_8_ = (uv_loop_t *)0x1;
    puStackY_128 = (uv_loop_t *)(long)rmdir_cb_count;
    if (puStackY_128 != (uv_loop_t *)0x1) goto LAB_0018b642;
    auStackY_138._0_8_ = (void *)0x18b49c;
    unlink("test_dir/file1");
    auStackY_138._0_8_ = (void *)0x18b4a8;
    unlink("test_dir/file2");
    auStackY_138._0_8_ = (void *)0x18b4b4;
    rmdir("test_dir");
    puVar4 = loop;
    auStackY_138._0_8_ = (void *)0x18b4cc;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    auStackY_138._0_8_ = (void *)0x18b4d6;
    uv_run(puVar4,UV_RUN_DEFAULT);
    auStackY_138._8_8_ = (uv_loop_t *)0x0;
    auStackY_138._0_8_ = (void *)0x18b4ea;
    iVar2 = uv_loop_close(loop);
    puStackY_128 = (uv_loop_t *)(long)iVar2;
    if ((uv_loop_t *)auStackY_138._8_8_ == puStackY_128) {
      auStackY_138._0_8_ = (void *)0x18b505;
      uv_library_shutdown();
      return;
    }
  }
  else {
LAB_0018b51a:
    auStackY_138._0_8_ = (void *)0x18b527;
    run_test_fs_async_dir_cold_1();
LAB_0018b527:
    auStackY_138._0_8_ = (void *)0x18b534;
    run_test_fs_async_dir_cold_2();
LAB_0018b534:
    puVar5 = puVar4;
    auStackY_138._0_8_ = (void *)0x18b541;
    run_test_fs_async_dir_cold_3();
LAB_0018b541:
    auStackY_138._0_8_ = (void *)0x18b54e;
    run_test_fs_async_dir_cold_27();
LAB_0018b54e:
    auStackY_138._0_8_ = (void *)0x18b55b;
    run_test_fs_async_dir_cold_4();
LAB_0018b55b:
    puVar4 = puVar5;
    auStackY_138._0_8_ = (void *)0x18b568;
    run_test_fs_async_dir_cold_5();
LAB_0018b568:
    auStackY_138._0_8_ = (void *)0x18b575;
    run_test_fs_async_dir_cold_26();
LAB_0018b575:
    auStackY_138._0_8_ = (void *)0x18b582;
    run_test_fs_async_dir_cold_6();
LAB_0018b582:
    auStackY_138._0_8_ = (void *)0x18b58f;
    run_test_fs_async_dir_cold_7();
LAB_0018b58f:
    auStackY_138._0_8_ = (void *)0x18b59c;
    run_test_fs_async_dir_cold_8();
LAB_0018b59c:
    auStackY_138._0_8_ = (void *)0x18b5a9;
    run_test_fs_async_dir_cold_9();
LAB_0018b5a9:
    auStackY_138._0_8_ = (void *)0x18b5b6;
    run_test_fs_async_dir_cold_10();
LAB_0018b5b6:
    auStackY_138._0_8_ = (void *)0x18b5bb;
    run_test_fs_async_dir_cold_25();
LAB_0018b5bb:
    auStackY_138._0_8_ = (void *)0x18b5c0;
    run_test_fs_async_dir_cold_12();
LAB_0018b5c0:
    auStackY_138._0_8_ = (void *)0x18b5cd;
    run_test_fs_async_dir_cold_13();
LAB_0018b5cd:
    auStackY_138._0_8_ = (void *)0x18b5da;
    run_test_fs_async_dir_cold_14();
LAB_0018b5da:
    auStackY_138._0_8_ = (void *)0x18b5e7;
    run_test_fs_async_dir_cold_15();
LAB_0018b5e7:
    auStackY_138._0_8_ = (void *)0x18b5f4;
    run_test_fs_async_dir_cold_16();
LAB_0018b5f4:
    auStackY_138._0_8_ = (void *)0x18b601;
    run_test_fs_async_dir_cold_17();
LAB_0018b601:
    auStackY_138._0_8_ = (void *)0x18b60e;
    run_test_fs_async_dir_cold_18();
LAB_0018b60e:
    auStackY_138._0_8_ = (void *)0x18b61b;
    run_test_fs_async_dir_cold_19();
LAB_0018b61b:
    auStackY_138._0_8_ = (void *)0x18b628;
    run_test_fs_async_dir_cold_20();
LAB_0018b628:
    auStackY_138._0_8_ = (void *)0x18b635;
    run_test_fs_async_dir_cold_21();
LAB_0018b635:
    auStackY_138._0_8_ = (void *)0x18b642;
    run_test_fs_async_dir_cold_22();
LAB_0018b642:
    auStackY_138._0_8_ = (void *)0x18b64f;
    run_test_fs_async_dir_cold_23();
  }
  auStackY_138._0_8_ = mkdir_cb;
  run_test_fs_async_dir_cold_24();
  if (puVar11 == &mkdir_req) {
    auStackY_138._0_8_ = SEXT48(mkdir_req.fs_type);
    p_StackY_140 = (uv_fs_cb)0x13;
    if ((code *)auStackY_138._0_8_ != (code *)0x13) goto LAB_0018b71e;
    auStackY_138._0_8_ = mkdir_req.result;
    p_StackY_140 = (uv_fs_cb)0x0;
    if (mkdir_req.result != 0) goto LAB_0018b72d;
    mkdir_cb_count = mkdir_cb_count + 1;
    if (mkdir_req.path == (char *)0x0) goto LAB_0018b73c;
    uVar6 = *(ulong *)mkdir_req.path;
    uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
            (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
            (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
    if (uVar6 == 0x746573745f646972) {
      uVar7 = (uint)(byte)mkdir_req.path[8];
    }
    else {
      uVar7 = -(uint)(uVar6 < 0x746573745f646972) | 1;
    }
    auStackY_138._0_8_ = SEXT48((int)uVar7);
    p_StackY_140 = (uv_fs_cb)0x0;
    if ((code *)auStackY_138._0_8_ == (code *)0x0) {
      uv_fs_req_cleanup(&mkdir_req);
      return;
    }
  }
  else {
    puStackY_150 = (uv_dirent_t *)0x18b71e;
    mkdir_cb_cold_1();
LAB_0018b71e:
    puStackY_150 = (uv_dirent_t *)0x18b72d;
    mkdir_cb_cold_2();
LAB_0018b72d:
    puStackY_150 = (uv_dirent_t *)0x18b73c;
    mkdir_cb_cold_3();
LAB_0018b73c:
    puStackY_150 = (uv_dirent_t *)0x18b741;
    mkdir_cb_cold_5();
  }
  puVar11 = (uv_fs_t *)auStackY_138;
  puStackY_150 = (uv_dirent_t *)scandir_cb;
  mkdir_cb_cold_4();
  puVar10 = (uv_fs_t *)auStackY_190;
  puStackY_170 = puVar4;
  p_StackY_168 = unaff_R12;
  pcStackY_160 = unaff_R13;
  puStackY_158 = unaff_R14;
  puStackY_150 = unaff_R15;
  if (puVar11 == &scandir_req) {
    auStackY_190._8_8_ = SEXT48(scandir_req.fs_type);
    auStackY_190._0_8_ = (void *)0x16;
    if ((uv_loop_t *)auStackY_190._8_8_ != (uv_loop_t *)0x16) goto LAB_0018b8b8;
    auStackY_190._8_8_ = (uv_loop_t *)0x2;
    auStackY_190._0_8_ = scandir_req.result;
    if (scandir_req.result != 2) goto LAB_0018b8c5;
    if (scandir_req.ptr == (void *)0x0) goto LAB_0018b8d2;
    pcStackY_198 = (code *)0x18b7d2;
    iVar2 = uv_fs_scandir_next(&scandir_req,(uv_dirent_t *)(auStackY_190 + 8));
    if (iVar2 != -0xfff) {
      do {
        __s1 = auStackY_190._8_8_;
        pcVar9 = "file1";
        pcStackY_198 = (code *)0x18b803;
        iVar2 = strcmp((char *)auStackY_190._8_8_,"file1");
        if (iVar2 != 0) {
          pcVar9 = "file2";
          pcStackY_198 = (code *)0x18b812;
          iVar2 = strcmp((char *)__s1,"file2");
          if (iVar2 != 0) {
            pcStackY_198 = (code *)0x18b8b3;
            scandir_cb_cold_4();
            goto LAB_0018b8b3;
          }
        }
        dent_00.name = (char *)(ulong)uStackY_180;
        pcStackY_198 = (code *)0x18b823;
        dent_00._8_8_ = pcVar9;
        assert_is_file_type(dent_00);
        pcStackY_198 = (code *)0x18b82e;
        iVar2 = uv_fs_scandir_next(&scandir_req,(uv_dirent_t *)(auStackY_190 + 8));
      } while (iVar2 != -0xfff);
    }
    scandir_cb_count = scandir_cb_count + 1;
    if (scandir_req.path == (char *)0x0) goto LAB_0018b8d7;
    uVar6 = *(ulong *)scandir_req.path;
    uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
            (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
            (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
    if (uVar6 == 0x746573745f646972) {
      uVar7 = (uint)(byte)scandir_req.path[8];
    }
    else {
      uVar7 = -(uint)(uVar6 < 0x746573745f646972) | 1;
    }
    auStackY_190._0_8_ = SEXT48((int)uVar7);
    pvStackY_178 = (void *)0x0;
    if ((void *)auStackY_190._0_8_ != (void *)0x0) goto LAB_0018b8dc;
    puVar10 = &scandir_req;
    pcStackY_198 = (code *)0x18b896;
    uv_fs_req_cleanup(&scandir_req);
    if (scandir_req.ptr == (void *)0x0) {
      return;
    }
  }
  else {
LAB_0018b8b3:
    pcStackY_198 = (code *)0x18b8b8;
    scandir_cb_cold_1();
LAB_0018b8b8:
    pcStackY_198 = (code *)0x18b8c5;
    scandir_cb_cold_2();
LAB_0018b8c5:
    pcStackY_198 = (code *)0x18b8d2;
    scandir_cb_cold_3();
LAB_0018b8d2:
    pcStackY_198 = (code *)0x18b8d7;
    scandir_cb_cold_8();
LAB_0018b8d7:
    pcStackY_198 = (code *)0x18b8dc;
    scandir_cb_cold_7();
LAB_0018b8dc:
    pcStackY_198 = (code *)0x18b8e9;
    scandir_cb_cold_5();
  }
  pcStackY_198 = assert_is_file_type;
  scandir_cb_cold_6();
  if ((uint)puVar10 < 2) {
    return;
  }
  auStackY_1b8._24_8_ = stat_cb;
  assert_is_file_type_cold_1();
  if (puVar10 == &stat_req) {
    if ((stat_req.fs_type & ~UV_FS_OPEN) != UV_FS_STAT) goto LAB_0018b969;
    auStackY_1b8._24_8_ = stat_req.result;
    auStackY_1b8._16_8_ = 0;
    if (stat_req.result != 0) goto LAB_0018b96e;
    puVar11 = &stat_req;
    if (stat_req.ptr == (void *)0x0) goto LAB_0018b97d;
    stat_cb_count = stat_cb_count + 1;
    puVar11 = &stat_req;
    auStackY_1b8._0_8_ = (void *)0x18b955;
    uv_fs_req_cleanup(&stat_req);
    if (stat_req.ptr == (void *)0x0) {
      return;
    }
  }
  else {
    auStackY_1b8._0_8_ = (void *)0x18b969;
    stat_cb_cold_1();
LAB_0018b969:
    auStackY_1b8._0_8_ = (void *)0x18b96e;
    stat_cb_cold_2();
LAB_0018b96e:
    puVar11 = (uv_fs_t *)(auStackY_1b8 + 0x18);
    auStackY_1b8._0_8_ = (void *)0x18b97d;
    stat_cb_cold_3();
LAB_0018b97d:
    auStackY_1b8._0_8_ = (void *)0x18b982;
    stat_cb_cold_5();
  }
  auStackY_1b8._0_8_ = unlink_cb;
  stat_cb_cold_4();
  if (puVar11 == &unlink_req) {
    auStackY_1b8._0_8_ = SEXT48(unlink_req.fs_type);
    if ((code *)auStackY_1b8._0_8_ != (code *)0x11) goto LAB_0018b9f4;
    auStackY_1b8._0_8_ = unlink_req.result;
    if (unlink_req.result == 0) {
      unlink_cb_count = unlink_cb_count + 1;
      uv_fs_req_cleanup(&unlink_req);
      return;
    }
  }
  else {
    unlink_cb_cold_1();
LAB_0018b9f4:
    unlink_cb_cold_2();
  }
  puVar11 = (uv_fs_t *)auStackY_1b8;
  unlink_cb_cold_3();
  if (puVar11 == &rmdir_req) {
    if (rmdir_req.fs_type != UV_FS_RMDIR) goto LAB_0018bad4;
    if (rmdir_req.result != 0) goto LAB_0018bae3;
    rmdir_cb_count = rmdir_cb_count + 1;
    if (rmdir_req.path != (char *)0x0) {
      uVar6 = *(ulong *)rmdir_req.path;
      uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18
              | (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18
              | (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
      if (uVar6 == 0x746573745f646972) {
        uVar7 = (uint)(byte)rmdir_req.path[8];
      }
      else {
        uVar7 = -(uint)(uVar6 < 0x746573745f646972) | 1;
      }
      if (uVar7 == 0) {
        uv_fs_req_cleanup(&rmdir_req);
        return;
      }
      goto LAB_0018baf7;
    }
  }
  else {
    rmdir_cb_cold_1();
LAB_0018bad4:
    rmdir_cb_cold_2();
LAB_0018bae3:
    rmdir_cb_cold_3();
  }
  rmdir_cb_cold_5();
LAB_0018baf7:
  rmdir_cb_cold_4();
  test_sendfile(sendfile_setup,sendfile_cb,0x10009);
  return;
}

Assistant:

static void create_cb(uv_fs_t* req) {
  uv_metrics_t metrics;

  ASSERT_OK(uv_metrics_info(uv_default_loop(), &metrics));
  /* Event count here is still 0 so not going to check. */
  ASSERT_UINT64_EQ(1, metrics.loop_count);
  ASSERT_GE(req->result, 0);

  uv_fs_req_cleanup(req);
  last_events_count = metrics.events;

  uv_buf_t iov = uv_buf_init(test_buf, sizeof(test_buf));
  ASSERT_OK(uv_fs_write(uv_default_loop(),
                        &fs_reqs.write_req,
                        (uv_os_fd_t) req->result,
                        &iov,
                        1,
                        0,
                        write_cb));
}